

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.h
# Opt level: O0

void __thiscall asl::XmlText::~XmlText(XmlText *this)

{
  XmlText *this_local;
  
  Xml::~Xml(&this->super_Xml);
  return;
}

Assistant:

class ASL_API XmlText : public Xml
{
protected:

	struct ASL_API _XmlText : public _Xml
	{
		String _text;
		_XmlText() {}
		_XmlText(const char* t) : _text(t) {}
		_XmlText(const String& t) : _text(t) {}
		const String& text() const { return _text; }
		bool isText() const { return true; }
		_Xml* clone(bool) const { return new _XmlText(_text); }
	};

	_XmlText* _() { return (_XmlText*)_p; }
	const _XmlText* _() const { return (_XmlText*)_p; }

public:
	typedef _XmlText NType;

	XmlText() : Xml(new _XmlText){
	}
	
	XmlText(const String& t) : Xml(new _XmlText(t))
	{
	}

	XmlText(const char* t) : Xml(new _XmlText(t))
	{
	}

	XmlText(_XmlText* p) : Xml(p)
	{
	}

	void append(const String& txt)
	{
		_()->_text += txt;
	}

	const String& text() const
	{
		return _()->_text;
	}
}